

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::DtlsSession::Read(Error *__return_storage_ptr__,DtlsSession *this)

{
  char cVar1;
  uint aMbedtlsError;
  char *pcVar2;
  char *pcVar3;
  ByteArray *aBytes;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  allocator_type local_502;
  allocator local_501;
  string local_500;
  writer write;
  undefined1 local_4c0 [40];
  undefined1 local_498 [8];
  string local_490;
  parse_func ap_Stack_470 [1];
  code *local_468;
  code *pcStack_460;
  code *local_458;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_450;
  uint8_t buf [1024];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (this->mState == kConnected) {
    aMbedtlsError = mbedtls_ssl_read(&this->mSsl,buf,0x400);
    if (0 < (int)aMbedtlsError) {
      std::__cxx11::string::string((string *)local_4c0,"dtls",&local_501);
      local_498 = (undefined1  [8])0x10000000e;
      local_490._M_dataplus._M_p._0_4_ = string_type;
      pcVar2 = "session(={}) successfully read data: len={}, {}";
      local_490._M_string_length = 0x1efc05;
      local_490.field_2._M_allocated_capacity = 0x2f;
      local_490.field_2._8_8_ = (type *)0x300000000;
      local_468 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      pcStack_460 = ::fmt::v10::detail::
                    parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
      local_458 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      write.handler_ = (format_string_checker<char> *)local_498;
      ap_Stack_470[0] = (parse_func)local_498;
      do {
        if (pcVar2 == "") {
LAB_0016e88a:
          std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_450,buf,
                     buf + (long)(ulong)aMbedtlsError,&local_502);
          utils::Hex_abi_cxx11_((string *)&write,(utils *)&local_450,aBytes);
          local_490.field_2._8_8_ = write.handler_;
          fmt.size_ = 0xd1e;
          fmt.data_ = (char *)0x2f;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)local_498;
          local_498 = (undefined1  [8])this;
          local_490._M_string_length = (size_type)(ulong)aMbedtlsError;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_500,(v10 *)"session(={}) successfully read data: len={}, {}",fmt,args_00
                    );
          Log(kDebug,(string *)local_4c0,&local_500);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&write);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_450);
          std::__cxx11::string::~string((string *)local_4c0);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_498,buf,
                     buf + (long)(ulong)aMbedtlsError,(allocator_type *)local_4c0);
          std::
          function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          ::operator()(&(this->super_Endpoint).mReceiver,&this->super_Endpoint,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_498);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_498);
          return __return_storage_ptr__;
        }
        cVar1 = *pcVar2;
        pcVar3 = pcVar2;
        while (cVar1 != '{') {
          pcVar3 = pcVar3 + 1;
          if (pcVar3 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&write,pcVar2,"");
            goto LAB_0016e88a;
          }
          cVar1 = *pcVar3;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&write,pcVar2,pcVar3);
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,int,std::__cxx11::string>&>
                           (pcVar3,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_498);
      } while( true );
    }
    if (aMbedtlsError == 0xffff9880) {
      this->mState = kConnecting;
      return __return_storage_ptr__;
    }
    if (aMbedtlsError != 0) {
      ErrorFromMbedtlsError((Error *)local_498,aMbedtlsError);
      Error::operator=(__return_storage_ptr__,(Error *)local_498);
      this_00 = &local_490;
      goto LAB_0016e86c;
    }
    local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffff00000000);
    local_490._M_dataplus._M_p = "underlying transport of the DTLS session was closed";
    local_490._M_string_length = 0x33;
    local_490.field_2._M_allocated_capacity = 0;
    ap_Stack_470[0] = (parse_func)0x0;
    pcVar2 = "underlying transport of the DTLS session was closed";
    write.handler_ = (format_string_checker<char> *)local_498;
    local_490.field_2._8_8_ = (format_string_checker<char> *)local_498;
    while (pcVar2 != "") {
      cVar1 = *pcVar2;
      pcVar3 = pcVar2;
      while (cVar1 != '{') {
        pcVar3 = pcVar3 + 1;
        if (pcVar3 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar2,"");
          goto LAB_0016ea58;
        }
        cVar1 = *pcVar3;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar2,pcVar3);
      pcVar2 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar3,"",(format_string_checker<char> *)local_498);
    }
LAB_0016ea58:
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_498;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_500,(v10 *)"underlying transport of the DTLS session was closed",
               (string_view)ZEXT816(0x33),args_01);
    local_4c0._0_4_ = kIOError;
    std::__cxx11::string::string((string *)(local_4c0 + 8),(string *)&local_500);
  }
  else {
    local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffff00000000);
    local_490._M_dataplus._M_p = "the DTLS session is not connected";
    local_490._M_string_length = 0x21;
    local_490.field_2._M_allocated_capacity = 0;
    ap_Stack_470[0] = (parse_func)0x0;
    pcVar2 = "the DTLS session is not connected";
    write.handler_ = (format_string_checker<char> *)local_498;
    local_490.field_2._8_8_ = (format_string_checker<char> *)local_498;
    while (pcVar2 != "") {
      cVar1 = *pcVar2;
      pcVar3 = pcVar2;
      while (cVar1 != '{') {
        pcVar3 = pcVar3 + 1;
        if (pcVar3 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar2,"");
          goto LAB_0016e81d;
        }
        cVar1 = *pcVar3;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar2,pcVar3);
      pcVar2 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar3,"",(format_string_checker<char> *)local_498);
    }
LAB_0016e81d:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_498;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_500,(v10 *)"the DTLS session is not connected",(string_view)ZEXT816(0x21),args
              );
    local_4c0._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_4c0 + 8),(string *)&local_500);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_4c0);
  std::__cxx11::string::~string((string *)(local_4c0 + 8));
  this_00 = &local_500;
LAB_0016e86c:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Read()
{
    int   rval = 0;
    Error error;

    uint8_t buf[kMaxContentLength];

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    rval = mbedtls_ssl_read(&mSsl, buf, sizeof(buf));

    if (rval > 0)
    {
        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) successfully read data: len={}, {}", static_cast<void *>(this), rval,
                  utils::Hex({buf, buf + rval}));
        mReceiver(*this, {buf, buf + static_cast<size_t>(rval)});
        ExitNow();
    }

    switch (rval)
    {
    case 0:
        // \c 0 if the read end of the underlying transport was closed
        // - in this case you must stop using the context (see below)
        error = ERROR_IO_ERROR("underlying transport of the DTLS session was closed");
        break;

    case MBEDTLS_ERR_SSL_CLIENT_RECONNECT:
        // Continue reconnection
        mState = State::kConnecting;
        break;

    default:
        error = ErrorFromMbedtlsError(rval);
        break;
    }

exit:
    return error;
}